

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_19cdc37::ResizeInternalTestLarge::PreEncodeFrameHook
          (ResizeInternalTestLarge *this,VideoSource *video,Encoder *encoder)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  aom_scaling_mode in_RAX;
  aom_scaling_mode mode;
  aom_scaling_mode local_28;
  
  bVar1 = this->change_config_;
  local_28 = in_RAX;
  uVar2 = (*video->_vptr_VideoSource[8])(video);
  if (bVar1 == true) {
    if (uVar2 != 0) {
      iVar3 = (*video->_vptr_VideoSource[8])(video);
      if (iVar3 != 1) {
        return;
      }
      local_28.h_scaling_mode = AOME_NORMAL;
      local_28.v_scaling_mode = AOME_NORMAL;
      libaom_test::Encoder::Control(encoder,0xb,&local_28);
      *(undefined1 **)&(this->super_ResizeTest).super_EncoderTest.cfg_.rc_min_quantizer =
           &DAT_3c0000003c;
      libaom_test::Encoder::Config(encoder,&(this->super_ResizeTest).super_EncoderTest.cfg_);
      return;
    }
    local_28.h_scaling_mode = AOME_ONETWO;
    local_28.v_scaling_mode = AOME_ONETWO;
  }
  else {
    if ((2 < uVar2) && (uVar2 = (*video->_vptr_VideoSource[8])(video), uVar2 < 6)) {
      local_28.h_scaling_mode = AOME_FOURFIVE;
      local_28.v_scaling_mode = AOME_THREEFIVE;
      libaom_test::Encoder::Control(encoder,0xb,&local_28);
    }
    uVar2 = (*video->_vptr_VideoSource[8])(video);
    if (uVar2 < 6) {
      return;
    }
    local_28.h_scaling_mode = AOME_NORMAL;
    local_28.v_scaling_mode = AOME_NORMAL;
  }
  libaom_test::Encoder::Control(encoder,0xb,&local_28);
  return;
}

Assistant:

void PreEncodeFrameHook(libaom_test::VideoSource *video,
                          libaom_test::Encoder *encoder) override {
    if (change_config_) {
      int new_q = 60;
      if (video->frame() == 0) {
        struct aom_scaling_mode mode = { AOME_ONETWO, AOME_ONETWO };
        encoder->Control(AOME_SET_SCALEMODE, &mode);
      } else if (video->frame() == 1) {
        struct aom_scaling_mode mode = { AOME_NORMAL, AOME_NORMAL };
        encoder->Control(AOME_SET_SCALEMODE, &mode);
        cfg_.rc_min_quantizer = cfg_.rc_max_quantizer = new_q;
        encoder->Config(&cfg_);
      }
    } else {
      if (video->frame() >= kStepDownFrame && video->frame() < kStepUpFrame) {
        struct aom_scaling_mode mode = { AOME_FOURFIVE, AOME_THREEFIVE };
        encoder->Control(AOME_SET_SCALEMODE, &mode);
      }
      if (video->frame() >= kStepUpFrame) {
        struct aom_scaling_mode mode = { AOME_NORMAL, AOME_NORMAL };
        encoder->Control(AOME_SET_SCALEMODE, &mode);
      }
    }
  }